

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ExpParameter::Clear(ExpParameter *this)

{
  ExpParameter *this_local;
  
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    this->shift_ = 0.0;
    this->base_ = -1.0;
    this->scale_ = 1.0;
  }
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void ExpParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ExpParameter)
  if (_has_bits_[0 / 32] & 7u) {
    shift_ = 0;
    base_ = -1;
    scale_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}